

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_rescale_enc.c
# Opt level: O0

int RescalePlane(uint8_t *src,int src_width,int src_height,int src_stride,uint8_t *dst,int dst_width
                ,int dst_height,int dst_stride,rescaler_t *work,int num_channels)

{
  int iVar1;
  int in_EDX;
  undefined4 in_R9D;
  undefined8 in_stack_00000018;
  int y;
  WebPRescaler rescaler;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff60;
  int iVar2;
  int in_stack_ffffffffffffff6c;
  WebPRescaler *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  uint8_t *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  WebPRescaler *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  iVar2 = 0;
  iVar1 = WebPRescalerInit(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                           in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                           in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                           in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,
                           (rescaler_t *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    while (iVar2 < in_EDX) {
      iVar1 = WebPRescalerImport(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                                 (uint8_t *)CONCAT44(iVar2,in_stack_ffffffffffffff60),
                                 (int)((ulong)in_stack_00000018 >> 0x20));
      iVar2 = iVar1 + iVar2;
      WebPRescalerExport((WebPRescaler *)CONCAT44(in_stack_ffffffffffffff54,rescaler.x_expand));
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int RescalePlane(const uint8_t* src,
                        int src_width, int src_height, int src_stride,
                        uint8_t* dst,
                        int dst_width, int dst_height, int dst_stride,
                        rescaler_t* const work,
                        int num_channels) {
  WebPRescaler rescaler;
  int y = 0;
  if (!WebPRescalerInit(&rescaler, src_width, src_height,
                        dst, dst_width, dst_height, dst_stride,
                        num_channels, work)) {
    return 0;
  }
  while (y < src_height) {
    y += WebPRescalerImport(&rescaler, src_height - y,
                            src + y * src_stride, src_stride);
    WebPRescalerExport(&rescaler);
  }
  return 1;
}